

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RandSequenceStatementSyntax *pRVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  Token *in_stack_00000030;
  SyntaxList<slang::syntax::ProductionSyntax> *in_stack_00000038;
  Token *in_stack_00000040;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  NamedLabelSyntax *in_stack_ffffffffffffff60;
  NamedLabelSyntax *local_78;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000010,in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  deepClone<slang::syntax::ProductionSyntax>
            ((SyntaxList<slang::syntax::ProductionSyntax> *)in_stack_00000010,in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)in_stack_00000010,(NamedLabelSyntax **)in_stack_00000008,
                      unaff_retaddr,(Token *)__fn,(Token *)__child_stack,(Token *)local_78,
                      in_stack_00000030,in_stack_00000038,in_stack_00000040);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandSequenceStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandSequenceStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.randsequence.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.firstProduction.deepClone(alloc),
        node.closeParen.deepClone(alloc),
        *deepClone(node.productions, alloc),
        node.endsequence.deepClone(alloc)
    );
}